

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int64_t get_time_t_max(void)

{
  uintmax_t max_signed_time_t;
  uintmax_t max_unsigned_time_t;
  
  return 0x7fffffffffffffff;
}

Assistant:

static int64_t
get_time_t_max(void)
{
#if defined(TIME_T_MAX)
	return TIME_T_MAX;
#else
	/* ISO C allows time_t to be a floating-point type,
	   but POSIX requires an integer type.  The following
	   should work on any system that follows the POSIX
	   conventions. */
	if (((time_t)0) < ((time_t)-1)) {
		/* Time_t is unsigned */
		return (~(time_t)0);
	} else {
		/* Time_t is signed. */
		const uintmax_t max_unsigned_time_t = (uintmax_t)(~(time_t)0);
		const uintmax_t max_signed_time_t = max_unsigned_time_t >> 1;
		return (time_t)max_signed_time_t;
	}
#endif
}